

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::MarkItemEdited(ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiID in_EDI;
  ImGuiContext *g;
  byte local_11;
  
  pIVar2 = GImGui;
  local_11 = 1;
  if ((GImGui->ActiveId != in_EDI) && (local_11 = 1, GImGui->ActiveId != 0)) {
    local_11 = GImGui->DragDropActive;
  }
  if ((local_11 & 1) == 0) {
    __assert_fail("g.ActiveId == id || g.ActiveId == 0 || g.DragDropActive",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xc09,"void ImGui::MarkItemEdited(ImGuiID)");
  }
  GImGui->ActiveIdHasBeenEditedThisFrame = true;
  pIVar2->ActiveIdHasBeenEditedBefore = true;
  pIVar1 = pIVar2->CurrentWindow;
  (pIVar1->DC).LastItemStatusFlags = (pIVar1->DC).LastItemStatusFlags | 4;
  return;
}

Assistant:

void ImGui::MarkItemEdited(ImGuiID id)
{
    // This marking is solely to be able to provide info for IsItemDeactivatedAfterEdit().
    // ActiveId might have been released by the time we call this (as in the typical press/release button behavior) but still need need to fill the data.
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId == id || g.ActiveId == 0 || g.DragDropActive);
    IM_UNUSED(id); // Avoid unused variable warnings when asserts are compiled out.
    //IM_ASSERT(g.CurrentWindow->DC.LastItemId == id);
    g.ActiveIdHasBeenEditedThisFrame = true;
    g.ActiveIdHasBeenEditedBefore = true;
    g.CurrentWindow->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;
}